

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::ForwardDynamicsConstraintsDirect
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               VectorNd *QDDot,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  ActualDstType actualDst;
  long lVar11;
  ConstraintSet *lambda;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  lambda = CS;
  CalcConstrainedSystemVariables(model,Q,QDot,Tau,CS,update_kinematics,f_ext);
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_38,*(Index *)(CS + 0x180),1);
  pdVar4 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar5 = *(long *)(CS + 0x178);
  if (local_38.m_storage.m_rows != *(ulong *)(CS + 0x180)) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_38,*(ulong *)(CS + 0x180),1);
  }
  uVar10 = local_38.m_storage.m_rows - (local_38.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_38.m_storage.m_rows) {
    lVar11 = 0;
    do {
      pdVar1 = pdVar4 + lVar11;
      dVar8 = pdVar1[1];
      pdVar2 = (double *)(lVar5 + lVar11 * 8);
      dVar9 = pdVar2[1];
      local_38.m_storage.m_data[lVar11] = *pdVar1 - *pdVar2;
      (local_38.m_storage.m_data + lVar11)[1] = dVar8 - dVar9;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar10);
  }
  if ((long)uVar10 < local_38.m_storage.m_rows) {
    do {
      local_38.m_storage.m_data[uVar10] = pdVar4[uVar10] - *(double *)(lVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (local_38.m_storage.m_rows != uVar10);
  }
  SolveConstrainedSystemDirect
            ((MatrixNd *)(CS + 0x160),(MatrixNd *)(CS + 0x198),(VectorNd *)&local_38,
             (VectorNd *)(CS + 0x188),(VectorNd *)lambda,(MatrixNd *)(CS + 0x1b0),
             (VectorNd *)(CS + 0x1c8),(VectorNd *)(CS + 0x1d8),(LinearSolver *)CS);
  free(local_38.m_storage.m_data);
  uVar3 = model->dof_count;
  if ((ulong)uVar3 != 0) {
    lVar5 = *(long *)(CS + 0x1d8);
    pdVar4 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar10 = 0;
    do {
      pdVar4[uVar10] = *(double *)(lVar5 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
  }
  lVar5 = *(long *)(CS + 0x10);
  lVar11 = *(long *)(CS + 8);
  if (lVar5 - lVar11 != 0) {
    lVar6 = *(long *)(CS + 0x130);
    lVar7 = *(long *)(CS + 0x1d8);
    uVar10 = 0;
    do {
      *(ulong *)(lVar6 + uVar10 * 8) =
           *(ulong *)(lVar7 + (ulong)(uVar3 + (int)uVar10) * 8) ^ 0x8000000000000000;
      uVar10 = uVar10 + 1;
    } while ((uVar10 & 0xffffffff) < (ulong)(lVar5 - lVar11 >> 2));
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsConstraintsDirect (
  Model &model,
  const VectorNd &Q,
  const VectorNd &QDot,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext
)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  CalcConstrainedSystemVariables (model, Q, QDot, Tau, CS, update_kinematics, 
                                  f_ext);

  SolveConstrainedSystemDirect (CS.H, CS.G, Tau - CS.C, CS.gamma
                                , CS.force, CS.A, CS.b, CS.x, CS.linear_solver);

  // Copy back QDDot
  for (unsigned int i = 0; i < model.dof_count; i++) {
    QDDot[i] = CS.x[i];
  }

  // Copy back contact forces
  for (unsigned int i = 0; i < CS.size(); i++) {
    CS.force[i] = -CS.x[model.dof_count + i];
  }
}